

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O0

REF_STATUS ref_fixture_twod_brick_grid(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi,REF_INT dim)

{
  REF_GRID pRVar1;
  REF_NODE ref_node_00;
  uint uVar2;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL dy;
  REF_DBL dx;
  REF_DBL z;
  REF_DBL y1;
  REF_DBL y0;
  REF_DBL x1;
  REF_DBL x0;
  REF_INT j;
  REF_INT i;
  REF_INT n;
  REF_INT m;
  REF_INT tri [4];
  int local_50;
  int local_4c;
  REF_INT edg [3];
  REF_INT cell;
  REF_INT node;
  REF_INT global;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_INT dim_local;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  ref_grid_ptr_local._4_4_ = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (ref_grid_ptr_local._4_4_ == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node_00 = pRVar1->node;
    pRVar1->twod = 1;
    if (pRVar1->mpi->id == 0) {
      for (x0._0_4_ = 0; x0._0_4_ < dim; x0._0_4_ = x0._0_4_ + 1) {
        for (x0._4_4_ = 0; x0._4_4_ < dim; x0._4_4_ = x0._4_4_ + 1) {
          uVar2 = ref_node_add(ref_node_00,(long)(x0._4_4_ + x0._0_4_ * dim),edg + 2);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x74f,"ref_fixture_twod_brick_grid",(ulong)uVar2,"node");
            return uVar2;
          }
          ref_node_00->real[edg[2] * 0xf] = (1.0 / (double)(dim + -1)) * (double)x0._4_4_ + 0.0;
          ref_node_00->real[edg[2] * 0xf + 1] = (1.0 / (double)(dim + -1)) * (double)x0._0_4_ + 0.0;
          ref_node_00->real[edg[2] * 0xf + 2] = 0.0;
        }
      }
      edg[0] = 1;
      for (x0._4_4_ = 0; x0._4_4_ < dim + -1; x0._4_4_ = x0._4_4_ + 1) {
        local_50 = x0._4_4_;
        local_4c = x0._4_4_ + 1;
        uVar2 = ref_cell_add(pRVar1->cell[0],&local_50,edg + 1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                 ,0x75b,"ref_fixture_twod_brick_grid",(ulong)uVar2,"qua");
          return uVar2;
        }
      }
      edg[0] = 2;
      for (x0._0_4_ = 0; x0._0_4_ < dim + -1; x0._0_4_ = x0._0_4_ + 1) {
        local_50 = dim + -1 + x0._0_4_ * dim;
        local_4c = dim + -1 + (x0._0_4_ + 1) * dim;
        uVar2 = ref_cell_add(pRVar1->cell[0],&local_50,edg + 1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                 ,0x763,"ref_fixture_twod_brick_grid",(ulong)uVar2,"edg");
          return uVar2;
        }
      }
      edg[0] = 3;
      for (x0._4_4_ = dim + -2; -1 < x0._4_4_; x0._4_4_ = x0._4_4_ + -1) {
        local_50 = x0._4_4_ + 1 + (dim + -1) * dim;
        local_4c = x0._4_4_ + (dim + -1) * dim;
        uVar2 = ref_cell_add(pRVar1->cell[0],&local_50,edg + 1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                 ,0x76b,"ref_fixture_twod_brick_grid",(ulong)uVar2,"edg");
          return uVar2;
        }
      }
      edg[0] = 4;
      for (x0._0_4_ = dim + -2; -1 < x0._0_4_; x0._0_4_ = x0._0_4_ + -1) {
        local_50 = (x0._0_4_ + 1) * dim;
        local_4c = x0._0_4_ * dim;
        uVar2 = ref_cell_add(pRVar1->cell[0],&local_50,edg + 1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                 ,0x773,"ref_fixture_twod_brick_grid",(ulong)uVar2,"edg");
          return uVar2;
        }
      }
      tri[1] = 1;
      for (x0._0_4_ = 0; x0._0_4_ < dim + -1; x0._0_4_ = x0._0_4_ + 1) {
        for (x0._4_4_ = 0; x0._4_4_ < dim + -1; x0._4_4_ = x0._4_4_ + 1) {
          n = x0._4_4_ + x0._0_4_ * dim;
          m = x0._4_4_ + 1 + x0._0_4_ * dim;
          tri[0] = x0._4_4_ + 1 + (x0._0_4_ + 1) * dim;
          uVar2 = ref_cell_add(pRVar1->cell[3],&n,edg + 1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x77d,"ref_fixture_twod_brick_grid",(ulong)uVar2,"tri");
            return uVar2;
          }
          n = x0._4_4_ + x0._0_4_ * dim;
          m = x0._4_4_ + 1 + (x0._0_4_ + 1) * dim;
          tri[0] = x0._4_4_ + (x0._0_4_ + 1) * dim;
          uVar2 = ref_cell_add(pRVar1->cell[3],&n,edg + 1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x781,"ref_fixture_twod_brick_grid",(ulong)uVar2,"tri");
            return uVar2;
          }
        }
      }
      ref_grid_ptr_local._4_4_ = ref_node_initialize_n_global(ref_node_00,(long)(dim * dim));
      if (ref_grid_ptr_local._4_4_ == 0) {
        ref_grid_ptr_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
               0x785,"ref_fixture_twod_brick_grid",(ulong)ref_grid_ptr_local._4_4_,"init glob");
      }
    }
    else {
      ref_grid_ptr_local._4_4_ = ref_node_initialize_n_global(ref_node_00,(long)(dim * dim));
      if (ref_grid_ptr_local._4_4_ == 0) {
        ref_grid_ptr_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
               0x73d,"ref_fixture_twod_brick_grid",(ulong)ref_grid_ptr_local._4_4_,"init glob");
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x736
           ,"ref_fixture_twod_brick_grid",(ulong)ref_grid_ptr_local._4_4_,"create");
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_twod_brick_grid(REF_GRID *ref_grid_ptr,
                                               REF_MPI ref_mpi, REF_INT dim) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global, node, cell;
  REF_INT edg[3], tri[4];

  REF_INT m, n;
  REF_INT i, j;

  REF_DBL x0 = 0.0;
  REF_DBL x1 = 1.0;

  REF_DBL y0 = 0.0;
  REF_DBL y1 = 1.0;

  REF_DBL z = 0.0;

  REF_DBL dx, dy;

  m = dim;
  n = dim;

  dx = (x1 - x0) / ((REF_DBL)(n - 1));
  dy = (y1 - y0) / ((REF_DBL)(m - 1));

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  if (!ref_mpi_once(ref_grid_mpi(ref_grid))) {
    RSS(ref_node_initialize_n_global(ref_node, m * n), "init glob");
    return REF_SUCCESS;
  }

  /*
  y   3 --- 2
  ^   |     |
  |   |     |
  |   0 --- 1
  |
  +----> x
  */

#define ij2node(i, j, m, n) ((i) + (j) * (m))

  for (j = 0; j < n; j++) {
    for (i = 0; i < m; i++) {
      global = ij2node(i, j, m, n);
      RSS(ref_node_add(ref_node, global, &node), "node");
      ref_node_xyz(ref_node, 0, node) = x0 + dx * (REF_DBL)i;
      ref_node_xyz(ref_node, 1, node) = y0 + dy * (REF_DBL)j;
      ref_node_xyz(ref_node, 2, node) = z;
    }
  }

  edg[2] = 1;
  j = 0;
  for (i = 0; i < m - 1; i++) {
    edg[0] = ij2node(i, j, m, n);
    edg[1] = ij2node(i + 1, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "qua");
  }

  edg[2] = 2;
  i = m - 1;
  for (j = 0; j < n - 1; j++) {
    edg[0] = ij2node(i, j, m, n);
    edg[1] = ij2node(i, j + 1, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  edg[2] = 3;
  j = n - 1;
  for (i = m - 2; i >= 0; i--) {
    edg[0] = ij2node(i + 1, j, m, n);
    edg[1] = ij2node(i, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  edg[2] = 4;
  i = 0;
  for (j = n - 2; j >= 0; j--) {
    edg[0] = ij2node(i, j + 1, m, n);
    edg[1] = ij2node(i, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  tri[3] = 1;
  j = 1;
  for (j = 0; j < n - 1; j++) {
    for (i = 0; i < m - 1; i++) {
      tri[0] = ij2node(i, j, m, n);
      tri[1] = ij2node(i + 1, j, m, n);
      tri[2] = ij2node(i + 1, j + 1, m, n);
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
      tri[0] = ij2node(i, j, m, n);
      tri[1] = ij2node(i + 1, j + 1, m, n);
      tri[2] = ij2node(i, j + 1, m, n);
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
    }
  }

  RSS(ref_node_initialize_n_global(ref_node, m * n), "init glob");

  return REF_SUCCESS;
}